

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall asmjit::Assembler::Assembler(Assembler *this)

{
  CodeEmitter::CodeEmitter(&this->super_CodeEmitter,1);
  (this->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)&PTR__Assembler_00198988;
  this->_section = (SectionEntry *)0x0;
  this->_bufferData = (uint8_t *)0x0;
  this->_bufferEnd = (uint8_t *)0x0;
  this->_bufferPtr = (uint8_t *)0x0;
  (this->_op4).field_0._packed[0] = (UInt64)0x0;
  (this->_op4).field_0._mem.field_2.offset64 = 0;
  (this->_op5).field_0._packed[0] = (UInt64)0x0;
  (this->_op5).field_0._mem.field_2.offset64 = 0;
  return;
}

Assistant:

Assembler::Assembler() noexcept
  : CodeEmitter(kTypeAssembler),
    _section(nullptr),
    _bufferData(nullptr),
    _bufferEnd(nullptr),
    _bufferPtr(nullptr),
    _op4(),
    _op5() {}